

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void __thiscall
VectorFormatter<DefaultFormatter>::
Ser<SizeComputer,std::vector<PrefilledTransaction,std::allocator<PrefilledTransaction>>>
          (VectorFormatter<DefaultFormatter> *this,SizeComputer *s,
          vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_> *v)

{
  long lVar1;
  bool bVar2;
  vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_> *in_RSI;
  long in_FS_OFFSET;
  value_type *elem;
  vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_> *__range2;
  DefaultFormatter formatter;
  const_iterator __end0;
  const_iterator __begin0;
  vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_> *in_stack_ffffffffffffffa8;
  reference in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>::size
            (in_stack_ffffffffffffffa8);
  WriteCompactSize((SizeComputer *)in_stack_ffffffffffffffb8,(uint64_t)in_RSI);
  std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>::begin(in_RSI);
  std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>::end(in_RSI);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_PrefilledTransaction_*,_std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>_>
                      ((__normal_iterator<const_PrefilledTransaction_*,_std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>_>
                        *)in_stack_ffffffffffffffb8,
                       (__normal_iterator<const_PrefilledTransaction_*,_std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>_>
                        *)in_RSI);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffb8 =
         __gnu_cxx::
         __normal_iterator<const_PrefilledTransaction_*,_std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>_>
         ::operator*((__normal_iterator<const_PrefilledTransaction_*,_std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>_>
                      *)in_stack_ffffffffffffffa8);
    DefaultFormatter::Ser<SizeComputer,PrefilledTransaction>
              ((SizeComputer *)in_stack_ffffffffffffffa8,(PrefilledTransaction *)0xf215f3);
    __gnu_cxx::
    __normal_iterator<const_PrefilledTransaction_*,_std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>_>
    ::operator++((__normal_iterator<const_PrefilledTransaction_*,_std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>_>
                  *)in_stack_ffffffffffffffa8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }